

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

void __thiscall t_xml_generator::iterate_program(t_xml_generator *this,t_program *program)

{
  string *val;
  _func_int **pp_Var1;
  int iVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  _Base_ptr p_Var3;
  size_type sVar4;
  t_xml_generator *this_00;
  _Alloc_hider _Var5;
  string *psVar6;
  pointer pptVar7;
  pointer pptVar8;
  pointer pptVar9;
  pointer pptVar10;
  pointer pptVar11;
  pointer pptVar12;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  vector<t_program_*,_std::allocator<t_program_*>_> programs;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  _Vector_base<t_const_*,_std::allocator<t_const_*>_> local_318;
  _Base_ptr local_300;
  string local_2f8;
  vector<t_program_*,_std::allocator<t_program_*>_> *local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *local_2c8;
  _Base_ptr local_2c0;
  _Vector_base<t_program_*,_std::allocator<t_program_*>_> local_2b8;
  _Vector_base<t_service_*,_std::allocator<t_service_*>_> local_2a0;
  _Vector_base<t_struct_*,_std::allocator<t_struct_*>_> local_288;
  _Vector_base<t_enum_*,_std::allocator<t_enum_*>_> local_270;
  _Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_> local_258;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [32];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  std::__cxx11::string::string((string *)(local_1a0 + 0x20),"document",(allocator *)&local_2f8);
  write_element_start(this,(string *)(local_1a0 + 0x20));
  std::__cxx11::string::~string((string *)(local_1a0 + 0x20));
  std::__cxx11::string::string((string *)local_1a0,"name",(allocator *)&local_2f8);
  psVar6 = &program->name_;
  std::__cxx11::string::string((string *)&local_1c0,(string *)psVar6);
  this_00 = (t_xml_generator *)local_1a0;
  write_attribute(this,(string *)this_00,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)local_1a0);
  if (this->should_use_namespaces_ == true) {
    target_namespace_abi_cxx11_(&local_2f8,this_00,program);
    std::__cxx11::string::string((string *)&local_1e0,"targetNamespace",(allocator *)&local_318);
    std::__cxx11::string::string((string *)&local_200,(string *)&local_2f8);
    write_attribute(this,&local_1e0,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator+(&local_220,"xmlns:",psVar6);
    std::__cxx11::string::string((string *)&local_240,(string *)&local_2f8);
    write_attribute(this,&local_220,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_2f8);
  }
  local_2d0 = psVar6;
  write_doc(this,&program->super_t_doc);
  local_2d8 = &program->includes_;
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)&local_2f8,local_2d8);
  for (_Var5._M_p = local_2f8._M_dataplus._M_p; _Var5._M_p != (pointer)local_2f8._M_string_length;
      _Var5._M_p = _Var5._M_p + 8) {
    std::__cxx11::string::string((string *)&local_80,"include",(allocator *)&local_318);
    write_element_start(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_a0,"name",(allocator *)&local_318);
    std::__cxx11::string::string((string *)&local_c0,(string *)(*(long *)_Var5._M_p + 0x50));
    write_attribute(this,&local_a0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    write_element_end(this);
  }
  local_2c0 = &(program->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2c8 = &program->namespace_annotations_;
  for (p_Var3 = (program->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar6 = (string *)(local_1a0 + 0x60), p_Var3 != local_2c0;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string((string *)psVar6,"namespace",(allocator *)&local_318);
    write_element_start(this,psVar6);
    std::__cxx11::string::~string((string *)psVar6);
    std::__cxx11::string::string((string *)(local_1a0 + 0x40),"name",(allocator *)&local_318);
    local_300 = p_Var3;
    std::__cxx11::string::string((string *)&local_e0,(string *)(p_Var3 + 1));
    write_attribute(this,(string *)(local_1a0 + 0x40),&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)(local_1a0 + 0x40));
    psVar6 = (string *)(local_1a0 + 0xa0);
    std::__cxx11::string::string((string *)psVar6,"value",(allocator *)&local_318);
    val = (string *)(local_1a0 + 0x80);
    std::__cxx11::string::string((string *)val,(string *)(local_300 + 2));
    write_attribute(this,psVar6,val);
    std::__cxx11::string::~string((string *)val);
    std::__cxx11::string::~string((string *)psVar6);
    __x = &std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::operator[](local_2c8,(key_type *)(p_Var3 + 1))->_M_t;
    p_Var3 = local_300;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_60,__x);
    generate_annotations
              (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    write_element_end(this);
  }
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)&local_318,&program->consts_);
  for (pptVar7 = local_318._M_impl.super__Vector_impl_data._M_start;
      pptVar7 != local_318._M_impl.super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    generate_constant(this,*pptVar7);
  }
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
            ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&local_258,&program->typedefs_);
  for (pptVar8 = local_258._M_impl.super__Vector_impl_data._M_start;
      pptVar8 != local_258._M_impl.super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar8);
  }
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
            ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&local_270,&program->enums_);
  for (pptVar9 = local_270._M_impl.super__Vector_impl_data._M_start;
      pptVar9 != local_270._M_impl.super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
    (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar9);
  }
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
            ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&local_288,&program->objects_);
  for (pptVar10 = local_288._M_impl.super__Vector_impl_data._M_start;
      pptVar10 != local_288._M_impl.super__Vector_impl_data._M_finish; pptVar10 = pptVar10 + 1) {
    iVar2 = (*((*pptVar10)->super_t_type).super_t_doc._vptr_t_doc[0xc])();
    pp_Var1 = (this->super_t_generator)._vptr_t_generator;
    if ((char)iVar2 == '\0') {
      (*pp_Var1[0x15])(this,*pptVar10);
    }
    else {
      (*pp_Var1[0x18])(this);
    }
  }
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&local_2a0,&program->services_);
  for (pptVar11 = local_2a0._M_impl.super__Vector_impl_data._M_start;
      pptVar11 != local_2a0._M_impl.super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
    (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar11);
  }
  write_element_end(this);
  if (this->should_merge_includes_ == true) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->programs_,local_2d0);
    std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
              ((vector<t_program_*,_std::allocator<t_program_*>_> *)&local_2b8,local_2d8);
    for (pptVar12 = local_2b8._M_impl.super__Vector_impl_data._M_start;
        pptVar12 != local_2b8._M_impl.super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
      sVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->programs_,&(*pptVar12)->name_);
      if (sVar4 == 0) {
        iterate_program(this,*pptVar12);
      }
    }
    std::_Vector_base<t_program_*,_std::allocator<t_program_*>_>::~_Vector_base(&local_2b8);
  }
  std::_Vector_base<t_service_*,_std::allocator<t_service_*>_>::~_Vector_base(&local_2a0);
  std::_Vector_base<t_struct_*,_std::allocator<t_struct_*>_>::~_Vector_base(&local_288);
  std::_Vector_base<t_enum_*,_std::allocator<t_enum_*>_>::~_Vector_base(&local_270);
  std::_Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>::~_Vector_base(&local_258);
  std::_Vector_base<t_const_*,_std::allocator<t_const_*>_>::~_Vector_base(&local_318);
  std::_Vector_base<t_program_*,_std::allocator<t_program_*>_>::~_Vector_base
            ((_Vector_base<t_program_*,_std::allocator<t_program_*>_> *)&local_2f8);
  return;
}

Assistant:

void t_xml_generator::iterate_program(t_program* program) {

  write_element_start("document");
  write_attribute("name", program->get_name());
  if (should_use_namespaces_) {
    const string targetNamespace = target_namespace(program);
    write_attribute("targetNamespace", targetNamespace);
    write_attribute("xmlns:" + program->get_name(), targetNamespace);
  }
  write_doc(program);

  const vector<t_program*> includes = program->get_includes();
  vector<t_program*>::const_iterator inc_it;
  for (inc_it = includes.begin(); inc_it != includes.end(); ++inc_it) {
    write_element_start("include");
    write_attribute("name", (*inc_it)->get_name());
    write_element_end();
  }

  const map<string, string>& namespaces = program->get_namespaces();
  map<string, string>::const_iterator ns_it;
  for (ns_it = namespaces.begin(); ns_it != namespaces.end(); ++ns_it) {
    write_element_start("namespace");
    write_attribute("name", ns_it->first);
    write_attribute("value", ns_it->second);
    generate_annotations(program->get_namespace_annotations(ns_it->first));
    write_element_end();
  }

  // TODO: can constants have annotations?
  vector<t_const*> consts = program->get_consts();
  vector<t_const*>::iterator c_iter;
  for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
    generate_constant(*c_iter);
  }

  vector<t_typedef*> typedefs = program->get_typedefs();
  vector<t_typedef*>::iterator td_iter;
  for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
    generate_typedef(*td_iter);
  }

  vector<t_enum*> enums = program->get_enums();
  vector<t_enum*>::iterator en_iter;
  for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
    generate_enum(*en_iter);
  }

  vector<t_struct*> objects = program->get_objects();
  vector<t_struct*>::iterator o_iter;
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    if ((*o_iter)->is_xception()) {
      generate_xception(*o_iter);
    } else {
      generate_struct(*o_iter);
    }
  }

  vector<t_service*> services = program->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    generate_service(*sv_iter);
  }

  write_element_end();

  if (should_merge_includes_) {
    programs_.insert(program->get_name());
    const vector<t_program*> programs = program->get_includes();
    vector<t_program*>::const_iterator prog_it;
    for (prog_it = programs.begin(); prog_it != programs.end(); ++prog_it) {
      if (!programs_.count((*prog_it)->get_name())) {
        iterate_program(*prog_it);
      }
    }
  }

}